

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Arena.cpp
# Opt level: O2

void amrex::Arena::PrintUsage(void)

{
  Arena *pAVar1;
  CArena *pCVar2;
  Arena *pAVar3;
  allocator local_29;
  string local_28;
  
  The_Arena();
  pAVar1 = The_Arena();
  pCVar2 = (CArena *)__dynamic_cast(pAVar1,&typeinfo,&CArena::typeinfo,0);
  if (pCVar2 != (CArena *)0x0) {
    std::__cxx11::string::string((string *)&local_28,"The         Arena",&local_29);
    CArena::PrintUsage(pCVar2,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
  }
  The_Device_Arena();
  pAVar1 = The_Device_Arena();
  pAVar3 = The_Arena();
  if (pAVar1 != pAVar3) {
    pAVar1 = The_Device_Arena();
    pCVar2 = (CArena *)__dynamic_cast(pAVar1,&typeinfo,&CArena::typeinfo,0);
    if (pCVar2 != (CArena *)0x0) {
      std::__cxx11::string::string((string *)&local_28,"The  Device Arena",&local_29);
      CArena::PrintUsage(pCVar2,&local_28);
      std::__cxx11::string::~string((string *)&local_28);
    }
  }
  The_Managed_Arena();
  pAVar1 = The_Managed_Arena();
  pAVar3 = The_Arena();
  if (pAVar1 != pAVar3) {
    pAVar1 = The_Managed_Arena();
    pCVar2 = (CArena *)__dynamic_cast(pAVar1,&typeinfo,&CArena::typeinfo,0);
    if (pCVar2 != (CArena *)0x0) {
      std::__cxx11::string::string((string *)&local_28,"The Managed Arena",&local_29);
      CArena::PrintUsage(pCVar2,&local_28);
      std::__cxx11::string::~string((string *)&local_28);
    }
  }
  The_Pinned_Arena();
  pAVar1 = The_Pinned_Arena();
  pCVar2 = (CArena *)__dynamic_cast(pAVar1,&typeinfo,&CArena::typeinfo,0);
  if (pCVar2 != (CArena *)0x0) {
    std::__cxx11::string::string((string *)&local_28,"The  Pinned Arena",&local_29);
    CArena::PrintUsage(pCVar2,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
  }
  return;
}

Assistant:

void
Arena::PrintUsage ()
{
#ifdef AMREX_USE_GPU
    const int IOProc = ParallelDescriptor::IOProcessorNumber();
    {
        Long min_megabytes = Gpu::Device::totalGlobalMem() / (1024*1024);
        Long max_megabytes = min_megabytes;
        ParallelDescriptor::ReduceLongMin(min_megabytes, IOProc);
        ParallelDescriptor::ReduceLongMax(max_megabytes, IOProc);
#ifdef AMREX_USE_MPI
        amrex::Print() << "Total GPU global memory (MB) spread across MPI: ["
                       << min_megabytes << " ... " << max_megabytes << "]\n";
#else
        amrex::Print() << "Total GPU global memory (MB): " << min_megabytes << "\n";
#endif
    }
    {
        Long min_megabytes = Gpu::Device::freeMemAvailable() / (1024*1024);
        Long max_megabytes = min_megabytes;
        ParallelDescriptor::ReduceLongMin(min_megabytes, IOProc);
        ParallelDescriptor::ReduceLongMax(max_megabytes, IOProc);
#ifdef AMREX_USE_MPI
        amrex::Print() << "Free  GPU global memory (MB) spread across MPI: ["
                       << min_megabytes << " ... " << max_megabytes << "]\n";
#else
        amrex::Print() << "Free  GPU global memory (MB): " << min_megabytes << "\n";
#endif
    }
#endif
    if (The_Arena()) {
        CArena* p = dynamic_cast<CArena*>(The_Arena());
        if (p) {
            p->PrintUsage("The         Arena");
        }
    }
    if (The_Device_Arena() && The_Device_Arena() != The_Arena()) {
        CArena* p = dynamic_cast<CArena*>(The_Device_Arena());
        if (p) {
            p->PrintUsage("The  Device Arena");
        }
    }
    if (The_Managed_Arena() && The_Managed_Arena() != The_Arena()) {
        CArena* p = dynamic_cast<CArena*>(The_Managed_Arena());
        if (p) {
            p->PrintUsage("The Managed Arena");
        }
    }
    if (The_Pinned_Arena()) {
        CArena* p = dynamic_cast<CArena*>(The_Pinned_Arena());
        if (p) {
            p->PrintUsage("The  Pinned Arena");
        }
    }
}